

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

QList<QLoggingRule> * __thiscall
QList<QLoggingRule>::operator+=(QList<QLoggingRule> *this,QList<QLoggingRule> *l)

{
  long n;
  Data *pDVar1;
  QLoggingRule *pQVar2;
  
  n = (l->d).size;
  if (n != 0) {
    pDVar1 = (l->d).d;
    if ((pDVar1 == (Data *)0x0) ||
       (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      pQVar2 = (l->d).ptr;
      QtPrivate::QCommonArrayOps<QLoggingRule>::growAppend
                ((QCommonArrayOps<QLoggingRule> *)this,pQVar2,pQVar2 + n);
    }
    else {
      QArrayDataPointer<QLoggingRule>::detachAndGrow
                (&this->d,GrowsAtEnd,n,(QLoggingRule **)0x0,(QArrayDataPointer<QLoggingRule> *)0x0);
      pQVar2 = (l->d).ptr;
      QtPrivate::QGenericArrayOps<QLoggingRule>::moveAppend
                ((QGenericArrayOps<QLoggingRule> *)this,pQVar2,pQVar2 + (l->d).size);
    }
  }
  return this;
}

Assistant:

QList<T> &operator+=(QList<T> &&l) { append(std::move(l)); return *this; }